

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_ftn_entry.h
# Opt level: O0

void __kmp_api_omp_set_lock_(void **user_lock)

{
  int iVar1;
  void *unaff_retaddr;
  int gtid;
  void **in_stack_00000060;
  kmp_int32 in_stack_0000006c;
  ident_t *in_stack_00000070;
  
  iVar1 = __kmp_get_global_thread_id_reg();
  if ((((((ulong)ompt_enabled & 1) != 0) && (-1 < iVar1)) &&
      (__kmp_threads[iVar1] != (kmp_info_t *)0x0)) &&
     ((__kmp_threads[iVar1]->th).ompt_thread_info.return_address == (void *)0x0)) {
    (__kmp_threads[iVar1]->th).ompt_thread_info.return_address = unaff_retaddr;
  }
  __kmpc_set_lock(in_stack_00000070,in_stack_0000006c,in_stack_00000060);
  return;
}

Assistant:

void FTN_STDCALL KMP_EXPAND_NAME(FTN_SET_LOCK)(void **user_lock) {
#ifdef KMP_STUB
  if (*((kmp_stub_lock_t *)user_lock) == UNINIT) {
    // TODO: Issue an error.
  }
  if (*((kmp_stub_lock_t *)user_lock) != UNLOCKED) {
    // TODO: Issue an error.
  }
  *((kmp_stub_lock_t *)user_lock) = LOCKED;
#else
  int gtid = __kmp_entry_gtid();
#if OMPT_SUPPORT && OMPT_OPTIONAL
  OMPT_STORE_RETURN_ADDRESS(gtid);
#endif
  __kmpc_set_lock(NULL, gtid, user_lock);
#endif
}